

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

bool winmd::reader::database::is_database(string_view *path)

{
  uint32_t uVar1;
  image_dos_header *__src;
  image_nt_headers32 *__src_00;
  image_nt_headers32plus *__src_01;
  image_section_header *last;
  image_cor20_header *__src_02;
  uint *puVar2;
  int local_31c [2];
  image_cor20_header cli;
  uint32_t offset;
  image_section_header *section;
  image_section_header *sections_end;
  string local_2b8;
  undefined1 local_298 [8];
  image_nt_headers32plus pe_plus;
  image_section_header *piStack_188;
  uint32_t com_virtual_address;
  image_section_header *sections;
  ushort local_176;
  image_nt_headers32 pe;
  short local_74 [4];
  image_dos_header dos;
  file_view file;
  string_view *path_local;
  
  file_view::file_view((file_view *)&dos.e_lfanew,path);
  uVar1 = byte_view::size((byte_view *)&dos.e_lfanew);
  if (uVar1 < 0x40) {
    path_local._7_1_ = false;
  }
  else {
    __src = byte_view::as<winmd::impl::image_dos_header>((byte_view *)&dos.e_lfanew,0);
    memcpy(local_74,__src,0x40);
    if (local_74[0] == 0x5a4d) {
      uVar1 = byte_view::size((byte_view *)&dos.e_lfanew);
      if ((ulong)uVar1 < (long)(int)dos.e_res2._12_4_ + 0xf8U) {
        path_local._7_1_ = false;
      }
      else {
        __src_00 = byte_view::as<winmd::impl::image_nt_headers32>
                             ((byte_view *)&dos.e_lfanew,dos.e_res2._12_4_);
        memcpy((void *)((long)&sections + 4),__src_00,0xf8);
        if ((local_176 == 0) || (100 < local_176)) {
          path_local._7_1_ = false;
        }
        else {
          pe_plus.OptionalHeader.DataDirectory[0xf].Size = 0;
          if ((short)pe.FileHeader.NumberOfSymbols == 0x10b) {
            pe_plus.OptionalHeader.DataDirectory[0xf].Size =
                 pe.OptionalHeader.DataDirectory[0xd].VirtualAddress;
            piStack_188 = byte_view::as<winmd::impl::image_section_header>
                                    ((byte_view *)&dos.e_lfanew,dos.e_res2._12_4_ + 0xf8);
          }
          else {
            if ((short)pe.FileHeader.NumberOfSymbols != 0x20b) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2b8,"Invalid optional header magic value",
                         (allocator<char> *)((long)&sections_end + 7));
              impl::throw_invalid(&local_2b8);
            }
            __src_01 = byte_view::as<winmd::impl::image_nt_headers32plus>
                                 ((byte_view *)&dos.e_lfanew,dos.e_res2._12_4_);
            memcpy(local_298,__src_01,0x108);
            pe_plus.OptionalHeader.DataDirectory[0xf].Size =
                 pe_plus.OptionalHeader.DataDirectory[0xd].VirtualAddress;
            piStack_188 = byte_view::as<winmd::impl::image_section_header>
                                    ((byte_view *)&dos.e_lfanew,dos.e_res2._12_4_ + 0x108);
          }
          last = piStack_188 + (int)(uint)local_176;
          register0x00000000 =
               section_from_rva(piStack_188,last,pe_plus.OptionalHeader.DataDirectory[0xf].Size);
          if (register0x00000000 == last) {
            path_local._7_1_ = false;
          }
          else {
            cli.ManagedNativeHeader.VirtualAddress =
                 offset_from_rva(register0x00000000,pe_plus.OptionalHeader.DataDirectory[0xf].Size);
            __src_02 = byte_view::as<winmd::impl::image_cor20_header>
                                 ((byte_view *)&dos.e_lfanew,cli.ManagedNativeHeader.VirtualAddress)
            ;
            memcpy(local_31c,__src_02,0x48);
            if (local_31c[0] == 0x48) {
              register0x00000000 = section_from_rva(piStack_188,last,cli.cb);
              if (register0x00000000 == last) {
                path_local._7_1_ = false;
              }
              else {
                cli.ManagedNativeHeader.VirtualAddress = offset_from_rva(register0x00000000,cli.cb);
                puVar2 = byte_view::as<unsigned_int>
                                   ((byte_view *)&dos.e_lfanew,
                                    cli.ManagedNativeHeader.VirtualAddress);
                if (*puVar2 == 0x424a5342) {
                  path_local._7_1_ = true;
                }
                else {
                  path_local._7_1_ = false;
                }
              }
            }
            else {
              path_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      path_local._7_1_ = false;
    }
  }
  dos.e_res2[8] = 1;
  dos.e_res2[9] = 0;
  file_view::~file_view((file_view *)&dos.e_lfanew);
  return path_local._7_1_;
}

Assistant:

static bool is_database(std::string_view const& path)
        {
            file_view file{ path };

            if (file.size() < sizeof(impl::image_dos_header))
            {
                return false;
            }

            auto dos = file.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                return false;
            }

            if (file.size() < (dos.e_lfanew + sizeof(impl::image_nt_headers32)))
            {
                return false;
            }

            auto pe = file.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                return false;
            }
            
            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = file.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                return false;
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = file.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                return false;
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                return false;
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (file.as<uint32_t>(offset) != 0x424a5342)
            {
                return false;
            }

            return true;
        }